

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O2

void __thiscall
cfd::js::api::json::GetCommitmentRequest::ConvertFromStruct
          (GetCommitmentRequest *this,GetCommitmentRequestStruct *data)

{
  this->amount_ = data->amount;
  std::__cxx11::string::_M_assign((string *)&this->asset_);
  std::__cxx11::string::_M_assign((string *)&this->asset_blind_factor_);
  std::__cxx11::string::_M_assign((string *)&this->blind_factor_);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->ignore_items)._M_t,&(data->ignore_items)._M_t);
  return;
}

Assistant:

void GetCommitmentRequest::ConvertFromStruct(
    const GetCommitmentRequestStruct& data) {
  amount_ = data.amount;
  asset_ = data.asset;
  asset_blind_factor_ = data.asset_blind_factor;
  blind_factor_ = data.blind_factor;
  ignore_items = data.ignore_items;
}